

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaSAXHandleText(void *ctx,xmlChar *ch,int len)

{
  int iVar1;
  xmlSchemaValidCtxtPtr vctxt;
  int len_local;
  xmlChar *ch_local;
  void *ctx_local;
  
  if ((-1 < *(int *)((long)ctx + 0xac)) &&
     ((*(int *)((long)ctx + 0x130) == -1 ||
      (*(int *)((long)ctx + 0xac) < *(int *)((long)ctx + 0x130))))) {
    if ((*(uint *)(*(long *)((long)ctx + 0xc0) + 0x40) & 0x20) != 0) {
      *(uint *)(*(long *)((long)ctx + 0xc0) + 0x40) =
           *(uint *)(*(long *)((long)ctx + 0xc0) + 0x40) ^ 0x20;
    }
    iVar1 = xmlSchemaVPushText((xmlSchemaValidCtxtPtr)ctx,3,ch,len,3,(int *)0x0);
    if (iVar1 == -1) {
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleCDataSection",
                 "calling xmlSchemaVPushText()");
      *(undefined4 *)((long)ctx + 0x68) = 0xffffffff;
      xmlStopParser(*(xmlParserCtxtPtr *)((long)ctx + 0x50));
    }
  }
  return;
}

Assistant:

static void
xmlSchemaSAXHandleText(void *ctx,
		       const xmlChar * ch,
		       int len)
{
    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctx;

    if (vctxt->depth < 0)
	return;
    if ((vctxt->skipDepth != -1) && (vctxt->depth >= vctxt->skipDepth))
	return;
    if (vctxt->inode->flags & XML_SCHEMA_ELEM_INFO_EMPTY)
	vctxt->inode->flags ^= XML_SCHEMA_ELEM_INFO_EMPTY;
    if (xmlSchemaVPushText(vctxt, XML_TEXT_NODE, ch, len,
	XML_SCHEMA_PUSH_TEXT_VOLATILE, NULL) == -1) {
	VERROR_INT("xmlSchemaSAXHandleCDataSection",
	    "calling xmlSchemaVPushText()");
	vctxt->err = -1;
	xmlStopParser(vctxt->parserCtxt);
    }
}